

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

double __thiscall ipx::Basis::MinSingularValue(Basis *this)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector v;
  Vector local_50;
  double local_40;
  Vector local_38;
  double local_28;
  
  local_50._M_size = (size_t)this->model_->num_rows_;
  uVar6 = local_50._M_size << 3;
  local_50._M_data = (double *)operator_new(uVar6);
  memset(local_50._M_data,0,uVar6);
  uVar7 = (uint)local_50._M_size;
  local_38._M_size = (size_t)(int)uVar7;
  uVar6 = local_38._M_size << 3;
  local_38._M_data = (double *)operator_new(uVar6);
  memset(local_38._M_data,0,uVar6);
  auVar1 = _DAT_003c57d0;
  if (0 < (int)uVar7) {
    lVar3 = (ulong)(uVar7 & 0x7fffffff) - 1;
    auVar9._8_4_ = (int)lVar3;
    auVar9._0_8_ = lVar3;
    auVar9._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_003c57d0;
    auVar10 = _DAT_003c57c0;
    do {
      auVar11 = auVar10 ^ auVar1;
      lVar3 = auVar10._8_8_;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        local_50._M_data[uVar6] = 1.0 / (double)(int)(auVar10._0_8_ + 1) + 1.0;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        local_50._M_data[uVar6 + 1] = 1.0 / (double)(int)(lVar3 + 1) + 1.0;
      }
      uVar6 = uVar6 + 2;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar3 + 2;
    } while ((uVar7 + 1 & 0xfffffffe) != uVar6);
  }
  dVar8 = Twonorm(&local_50);
  if (0 < (long)local_50._M_size) {
    pdVar2 = local_50._M_data;
    do {
      *pdVar2 = *pdVar2 / dVar8;
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 < local_50._M_data + local_50._M_size);
  }
  iVar5 = 0;
  dVar8 = 0.0;
  do {
    if (iVar5 == 100) break;
    local_40 = dVar8;
    LuUpdate::SolveDense
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,&local_50,&local_38,'N');
    LuUpdate::SolveDense
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,&local_38,&local_38,'T');
    dVar8 = Twonorm(&local_38);
    if (local_50._M_size == local_38._M_size) {
      if (local_50._M_size != 0) {
        sVar4 = 0;
        do {
          local_50._M_data[sVar4] = local_38._M_data[sVar4] / dVar8;
          sVar4 = sVar4 + 1;
        } while (local_50._M_size != sVar4);
      }
    }
    else {
      local_28 = dVar8;
      if (local_50._M_data != (double *)0x0) {
        operator_delete(local_50._M_data);
      }
      local_50._M_size = local_38._M_size;
      local_50._M_data = (double *)operator_new(local_38._M_size << 3);
      dVar8 = local_28;
      if (local_50._M_size != 0) {
        sVar4 = 0;
        do {
          local_50._M_data[sVar4] = local_38._M_data[sVar4] / local_28;
          sVar4 = sVar4 + 1;
        } while (local_50._M_size != sVar4);
      }
    }
    iVar5 = iVar5 + 1;
  } while (dVar8 * 0.001 < ABS(dVar8 - local_40));
  local_28 = dVar8;
  operator_delete(local_38._M_data);
  dVar8 = 1.0 / local_28;
  if (dVar8 < 0.0) {
    local_40 = sqrt(dVar8);
  }
  else {
    local_40 = SQRT(dVar8);
  }
  operator_delete(local_50._M_data);
  return local_40;
}

Assistant:

double Basis::MinSingularValue() const {
    const Int m = model_.rows();
    Vector v(m);

    // Computes maximum eigenvalue of inverse(B*B').
    double lambda = PowerMethod(
        [this](const Vector& x, Vector& fx) {
            SolveDense(x, fx, 'N');
            SolveDense(fx, fx, 'T'); }, v);
    return std::sqrt(1.0/lambda);
}